

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ladspa.c
# Opt level: O2

int ladspa_segment_get(uint32_t field,void *value,mixed_segment *segment)

{
  long lVar1;
  uint uVar2;
  ulong uVar3;
  uint32_t uVar4;
  
  lVar1 = *segment->data;
  uVar4 = 0;
  uVar2 = 0;
  do {
    uVar3 = (ulong)uVar2;
    if (*(ulong *)(lVar1 + 0x30) <= uVar3) {
      mixed_err(7);
      return 0;
    }
    if ((~*(uint *)(*(long *)(lVar1 + 0x38) + uVar3 * 4) & 6) == 0) {
      if (uVar4 == field) {
        *(undefined4 *)value =
             *(undefined4 *)(*(long *)((long)segment->data + 0x18) + 0xc + uVar3 * 0x10);
        return 1;
      }
      uVar4 = uVar4 + 1;
    }
    uVar2 = uVar2 + 1;
  } while( true );
}

Assistant:

int ladspa_segment_get(uint32_t field, void *value, struct mixed_segment *segment){
  // I don't think the LADSPA interface is compatible with how we want
  // to use it. If I read it correctly, it says that the output controls
  // are only updated while the plugin is actually run, which is not
  // what we want here in most cases.
  struct ladspa_segment_data *data = (struct ladspa_segment_data *)segment->data;
  uint32_t index = 0;
  for(uint32_t i=0; i<data->descriptor->PortCount; ++i){
    const LADSPA_PortDescriptor port = data->descriptor->PortDescriptors[i];
    if(LADSPA_IS_PORT_CONTROL(port) && LADSPA_IS_PORT_OUTPUT(port)){
      if(index == field){
        *((float *)value) = data->ports[i].control;
        return 1;
      }
      ++index;
    }
  }
  mixed_err(MIXED_INVALID_FIELD);
  return 0;
}